

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O1

FT_Error tt_face_load_sbit_image
                   (TT_Face face,FT_ULong strike_index,FT_UInt glyph_index,FT_UInt load_flags,
                   FT_Stream stream,FT_Bitmap *map,TT_SBit_MetricsRec *metrics)

{
  FT_UInt *pFVar1;
  FT_Stream stream_00;
  FT_Library library;
  long lVar2;
  FT_UShort FVar3;
  FT_UShort FVar4;
  int iVar5;
  int iVar6;
  FT_ULong FVar7;
  FT_ULong FVar8;
  undefined4 in_register_00000014;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  byte local_ac;
  ushort local_a2;
  ulong local_a0;
  ulong local_98;
  long local_90;
  TT_SBitDecoderRec decoder [1];
  
  uVar9 = CONCAT44(in_register_00000014,glyph_index);
  if (face->sbit_table_type - TT_SBIT_TABLE_TYPE_EBLC < 2) {
    if (face->ebdt_size == 0) {
      iVar5 = 0x8e;
    }
    else {
      stream_00 = (face->root).stream;
      uVar10 = face->sbit_strike_map[strike_index];
      iVar5 = FT_Stream_Seek(stream_00,face->ebdt_start);
      if (iVar5 == 0) {
        decoder[0].bitmap = &((face->root).glyph)->bitmap;
        decoder[0].metrics = metrics;
        decoder[0].metrics_loaded = '\0';
        decoder[0].bitmap_allocated = '\0';
        decoder[0].ebdt_start = face->ebdt_start;
        decoder[0].ebdt_size = face->ebdt_size;
        decoder[0].eblc_base = face->sbit_table;
        uVar9 = face->sbit_table_size;
        decoder[0].eblc_limit = decoder[0].eblc_base + uVar9;
        iVar5 = 3;
        decoder[0].face = face;
        decoder[0].stream = stream_00;
        if ((ulong)uVar10 * 0x30 + 0x37 <= uVar9) {
          lVar2 = (ulong)uVar10 * 0x30;
          uVar10 = *(uint *)(decoder[0].eblc_base + lVar2 + 8);
          decoder[0].strike_index_array =
               (FT_ULong)
               (uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18)
          ;
          uVar10 = *(uint *)(decoder[0].eblc_base + lVar2 + 0x10);
          decoder[0].strike_index_count =
               (FT_ULong)
               (uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 | uVar10 << 0x18)
          ;
          decoder[0].bit_depth = decoder[0].eblc_base[lVar2 + 0x36];
          if ((uVar9 < decoder[0].strike_index_array) ||
             (iVar5 = 0, uVar9 - decoder[0].strike_index_array >> 3 < decoder[0].strike_index_count)
             ) {
            iVar5 = 3;
          }
        }
      }
    }
    if (iVar5 == 0) {
      iVar5 = tt_sbit_decoder_load_image(decoder,glyph_index,0,0,0,(byte)(load_flags >> 0x16) & 1);
    }
  }
  else {
    iVar5 = 2;
    if (face->sbit_table_type == TT_SBIT_TABLE_TYPE_SBIX) {
      uVar10 = face->sbit_strike_map[strike_index];
      metrics->height = 0;
      metrics->width = 0;
      if (glyph_index <= (uint)(face->root).num_glyphs) {
        local_ac = (byte)(load_flags >> 0x16) & 1;
        uVar10 = *(uint *)(face->sbit_table + (ulong)uVar10 * 4 + 8);
        local_a0 = (ulong)(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                          uVar10 << 0x18);
        local_90 = local_a0 + 4;
        iVar11 = 5;
        do {
          iVar6 = 3;
          iVar5 = iVar6;
          if ((((face->ebdt_size <= local_a0) ||
               (face->ebdt_size - local_a0 < (ulong)((int)uVar9 * 4 + 0xc))) ||
              (local_98 = uVar9,
              iVar5 = FT_Stream_Seek(stream,(ulong)(uint)((int)uVar9 * 4) + local_90 +
                                            face->ebdt_start), iVar5 != 0)) ||
             (iVar5 = FT_Stream_EnterFrame(stream,8), iVar5 != 0)) goto LAB_00160dd3;
          FVar7 = FT_Stream_GetULong(stream);
          FVar8 = FT_Stream_GetULong(stream);
          FT_Stream_ExitFrame(stream);
          uVar10 = (uint)FVar8 - (uint)FVar7;
          if (uVar10 == 0) {
            iVar5 = 6;
            goto LAB_00160dd3;
          }
          iVar5 = iVar6;
          if ((((uint)FVar8 < (uint)FVar7) || (uVar10 < 8)) ||
             ((face->ebdt_size - local_a0 < (FVar8 & 0xffffffff) ||
              ((iVar5 = FT_Stream_Seek(stream,(FVar7 & 0xffffffff) + local_a0 + face->ebdt_start),
               iVar5 != 0 || (iVar5 = FT_Stream_EnterFrame(stream,(ulong)uVar10), iVar5 != 0))))))
          goto LAB_00160dd3;
          FVar3 = FT_Stream_GetUShort(stream);
          FVar4 = FT_Stream_GetUShort(stream);
          FVar7 = FT_Stream_GetULong(stream);
          iVar6 = (int)FVar7;
          if (iVar6 != 0x64757065) {
            iVar5 = 2;
            if (iVar6 < 0x7267626c) {
              if (iVar6 != 0x6a706720) {
                if (iVar6 != 0x706e6720) goto LAB_00160d58;
                iVar5 = Load_SBit_Png((face->root).glyph,0,0,0x20,metrics,stream->memory,
                                      stream->cursor,uVar10 - 8,'\x01',local_ac);
              }
            }
            else if ((iVar6 != 0x7267626c) && (iVar6 != 0x74696666)) {
LAB_00160d58:
              iVar5 = 7;
            }
LAB_00160d6e:
            FT_Stream_ExitFrame(stream);
            if (iVar5 == 0) {
              tt_face_get_metrics(face,'\0',(FT_UInt)local_98,(FT_Short *)decoder,&local_a2);
              metrics->horiBearingX = FVar3;
              metrics->horiBearingY = metrics->height - FVar4;
              metrics->horiAdvance =
                   (FT_UShort)
                   (((uint)(((face->root).size)->metrics).x_ppem * (uint)local_a2) /
                   (uint)(face->header).Units_Per_EM);
            }
            goto LAB_00160dd3;
          }
          iVar11 = iVar11 + -1;
          if (iVar11 == 0) {
            iVar5 = 3;
            goto LAB_00160d6e;
          }
          FVar3 = FT_Stream_GetUShort(stream);
          uVar9 = (ulong)FVar3;
          FT_Stream_ExitFrame(stream);
        } while ((uint)FVar3 <= (uint)(face->root).num_glyphs);
      }
      iVar5 = 6;
    }
  }
LAB_00160dd3:
  if (((iVar5 == 0) && (iVar5 = 0, (load_flags & 0x500000) == 0)) && (map->pixel_mode == '\a')) {
    library = ((face->root).glyph)->library;
    FT_Bitmap_Init((FT_Bitmap *)decoder);
    iVar5 = FT_Bitmap_Convert(library,map,(FT_Bitmap *)decoder,1);
    if (iVar5 == 0) {
      map->pixel_mode = decoder[0].metrics._2_1_;
      map->pitch = (int)decoder[0].stream;
      map->num_grays = (unsigned_short)decoder[0].metrics;
      ft_glyphslot_set_bitmap((face->root).glyph,(FT_Byte *)decoder[0].bitmap);
      pFVar1 = &((face->root).glyph)->internal->flags;
      *pFVar1 = *pFVar1 | 1;
    }
    else {
      FT_Bitmap_Done(library,(FT_Bitmap *)decoder);
    }
  }
  return iVar5;
}

Assistant:

FT_LOCAL( FT_Error )
  tt_face_load_sbit_image( TT_Face              face,
                           FT_ULong             strike_index,
                           FT_UInt              glyph_index,
                           FT_UInt              load_flags,
                           FT_Stream            stream,
                           FT_Bitmap           *map,
                           TT_SBit_MetricsRec  *metrics )
  {
    FT_Error  error = FT_Err_Ok;


    switch ( (FT_UInt)face->sbit_table_type )
    {
    case TT_SBIT_TABLE_TYPE_EBLC:
    case TT_SBIT_TABLE_TYPE_CBLC:
      {
        TT_SBitDecoderRec  decoder[1];


        error = tt_sbit_decoder_init( decoder, face, strike_index, metrics );
        if ( !error )
        {
          error = tt_sbit_decoder_load_image(
                    decoder,
                    glyph_index,
                    0,
                    0,
                    0,
                    ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY ) != 0 );
          tt_sbit_decoder_done( decoder );
        }
      }
      break;

    case TT_SBIT_TABLE_TYPE_SBIX:
      error = tt_face_load_sbix_image(
                face,
                strike_index,
                glyph_index,
                stream,
                map,
                metrics,
                ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY ) != 0 );
      break;

    default:
      error = FT_THROW( Unknown_File_Format );
      break;
    }

    /* Flatten color bitmaps if color was not requested. */
    if ( !error                                        &&
         !( load_flags & FT_LOAD_COLOR )               &&
         !( load_flags & FT_LOAD_BITMAP_METRICS_ONLY ) &&
         map->pixel_mode == FT_PIXEL_MODE_BGRA         )
    {
      FT_Bitmap   new_map;
      FT_Library  library = face->root.glyph->library;


      FT_Bitmap_Init( &new_map );

      /* Convert to 8bit grayscale. */
      error = FT_Bitmap_Convert( library, map, &new_map, 1 );
      if ( error )
        FT_Bitmap_Done( library, &new_map );
      else
      {
        map->pixel_mode = new_map.pixel_mode;
        map->pitch      = new_map.pitch;
        map->num_grays  = new_map.num_grays;

        ft_glyphslot_set_bitmap( face->root.glyph, new_map.buffer );
        face->root.glyph->internal->flags |= FT_GLYPH_OWN_BITMAP;
      }
    }

    return error;
  }